

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionEvaluationFile.cxx
# Opt level: O0

void __thiscall
cmGeneratorExpressionEvaluationFile::Generate
          (cmGeneratorExpressionEvaluationFile *this,string *config,string *lang,
          cmCompiledGeneratorExpression *inputExpression,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *outputFiles,mode_t perm)

{
  cmMakefile *pcVar1;
  bool bVar2;
  __type _Var3;
  cmCompiledGeneratorExpression *pcVar4;
  string *psVar5;
  ulong uVar6;
  char *pcVar7;
  pointer ppVar8;
  ostream *poVar9;
  mapped_type *this_00;
  undefined1 local_690 [8];
  cmGeneratedFileStream fout;
  string local_440;
  string local_420;
  undefined1 local_400 [8];
  ostringstream e_1;
  _Self local_288;
  _Self local_280;
  iterator it;
  undefined1 local_270 [8];
  string outputContent;
  undefined1 local_248 [8];
  string outputFileName;
  undefined1 local_208 [8];
  ostringstream e;
  allocator local_85 [13];
  undefined1 local_78 [8];
  string condResult;
  string rawCondition;
  mode_t perm_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *outputFiles_local;
  cmCompiledGeneratorExpression *inputExpression_local;
  string *lang_local;
  string *config_local;
  cmGeneratorExpressionEvaluationFile *this_local;
  
  pcVar4 = cmsys::auto_ptr<cmCompiledGeneratorExpression>::operator->(&this->Condition);
  psVar5 = cmCompiledGeneratorExpression::GetInput_abi_cxx11_(pcVar4);
  std::__cxx11::string::string((string *)(condResult.field_2._M_local_buf + 8),(string *)psVar5);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    pcVar4 = cmsys::auto_ptr<cmCompiledGeneratorExpression>::operator->(&this->Condition);
    pcVar7 = cmCompiledGeneratorExpression::Evaluate
                       (pcVar4,this->Makefile,config,false,(cmTarget *)0x0,(cmTarget *)0x0,
                        (cmGeneratorExpressionDAGChecker *)0x0,lang);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_78,pcVar7,local_85);
    std::allocator<char>::~allocator((allocator<char> *)local_85);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_78,"0");
    if (bVar2) {
      bVar2 = true;
    }
    else {
      bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_78,"1");
      if (bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
        poVar9 = std::operator<<((ostream *)local_208,"Evaluation file condition \"");
        poVar9 = std::operator<<(poVar9,(string *)(condResult.field_2._M_local_buf + 8));
        poVar9 = std::operator<<(poVar9,"\" did not evaluate to valid content. Got \"");
        poVar9 = std::operator<<(poVar9,(string *)local_78);
        std::operator<<(poVar9,"\".");
        pcVar1 = this->Makefile;
        std::__cxx11::ostringstream::str();
        cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)((long)&outputFileName.field_2 + 8));
        std::__cxx11::string::~string((string *)(outputFileName.field_2._M_local_buf + 8));
        bVar2 = true;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_208);
      }
      else {
        bVar2 = false;
      }
    }
    std::__cxx11::string::~string((string *)local_78);
    if (bVar2) goto LAB_0076ccdf;
  }
  pcVar4 = cmsys::auto_ptr<cmCompiledGeneratorExpression>::operator->(&this->OutputFileExpr);
  pcVar7 = cmCompiledGeneratorExpression::Evaluate
                     (pcVar4,this->Makefile,config,false,(cmTarget *)0x0,(cmTarget *)0x0,
                      (cmGeneratorExpressionDAGChecker *)0x0,lang);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_248,pcVar7,(allocator *)(outputContent.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(outputContent.field_2._M_local_buf + 0xf));
  pcVar7 = cmCompiledGeneratorExpression::Evaluate
                     (inputExpression,this->Makefile,config,false,(cmTarget *)0x0,(cmTarget *)0x0,
                      (cmGeneratorExpressionDAGChecker *)0x0,lang);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_270,pcVar7,(allocator *)((long)&it._M_node + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_node + 7));
  local_280._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(outputFiles,(key_type *)local_248);
  local_288._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(outputFiles);
  bVar2 = std::operator!=(&local_280,&local_288);
  if (bVar2) {
    ppVar8 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_280);
    _Var3 = std::operator==(&ppVar8->second,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_270);
    if (!_Var3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_400);
      poVar9 = std::operator<<((ostream *)local_400,
                               "Evaluation file to be written multiple times for different configurations or languages with different content:\n  "
                              );
      std::operator<<(poVar9,(string *)local_248);
      pcVar1 = this->Makefile;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_420);
      std::__cxx11::string::~string((string *)&local_420);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_400);
    }
  }
  else {
    pcVar1 = this->Makefile;
    pcVar7 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_440,pcVar7,(allocator *)&fout.field_0x247);
    cmMakefile::AddCMakeOutputFile(pcVar1,&local_440);
    std::__cxx11::string::~string((string *)&local_440);
    std::allocator<char>::~allocator((allocator<char> *)&fout.field_0x247);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->Files,(value_type *)local_248);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](outputFiles,(key_type *)local_248);
    std::__cxx11::string::operator=((string *)this_00,(string *)local_270);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_690,pcVar7,false);
    cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_690,true);
    std::operator<<((ostream *)local_690,(string *)local_270);
    bVar2 = cmGeneratedFileStream::Close((cmGeneratedFileStream *)local_690);
    if ((bVar2) && (perm != 0)) {
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmsys::SystemTools::SetPermissions(pcVar7,perm);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_690);
  }
  std::__cxx11::string::~string((string *)local_270);
  std::__cxx11::string::~string((string *)local_248);
LAB_0076ccdf:
  std::__cxx11::string::~string((string *)(condResult.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmGeneratorExpressionEvaluationFile::Generate(const std::string& config,
              const std::string& lang,
              cmCompiledGeneratorExpression* inputExpression,
              std::map<std::string, std::string> &outputFiles, mode_t perm)
{
  std::string rawCondition = this->Condition->GetInput();
  if (!rawCondition.empty())
    {
    std::string condResult = this->Condition->Evaluate(this->Makefile, config,
                                                       false, 0, 0, 0, lang);
    if (condResult == "0")
      {
      return;
      }
    if (condResult != "1")
      {
      std::ostringstream e;
      e << "Evaluation file condition \"" << rawCondition << "\" did "
          "not evaluate to valid content. Got \"" << condResult << "\".";
      this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
      return;
      }
    }

  const std::string outputFileName
                    = this->OutputFileExpr->Evaluate(this->Makefile, config,
                                                     false, 0, 0, 0, lang);
  const std::string outputContent
                          = inputExpression->Evaluate(this->Makefile, config,
                                                      false, 0, 0, 0, lang);

  std::map<std::string, std::string>::iterator it
                                          = outputFiles.find(outputFileName);

  if(it != outputFiles.end())
    {
    if (it->second == outputContent)
      {
      return;
      }
    std::ostringstream e;
    e << "Evaluation file to be written multiple times for different "
         "configurations or languages with different content:\n  "
      << outputFileName;
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
    }

  this->Makefile->AddCMakeOutputFile(outputFileName.c_str());
  this->Files.push_back(outputFileName);
  outputFiles[outputFileName] = outputContent;

  cmGeneratedFileStream fout(outputFileName.c_str());
  fout.SetCopyIfDifferent(true);
  fout << outputContent;
  if (fout.Close() && perm)
    {
    cmSystemTools::SetPermissions(outputFileName.c_str(), perm);
    }
}